

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O1

char * parse_text(char *data,char delim,uint *len)

{
  ushort uVar1;
  ushort *puVar2;
  uint uVar3;
  bool bVar4;
  int iVar5;
  ushort **ppuVar6;
  LY_ERR *pLVar7;
  char *pcVar8;
  uint uVar9;
  char cVar10;
  undefined7 in_register_00000031;
  long lVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  char local_448 [8];
  char buf [1024];
  char *local_38;
  
  buf._1020_4_ = (undefined4)CONCAT71(in_register_00000031,delim);
  *len = 0;
  local_38 = (char *)0x0;
  uVar13 = 0;
  uVar3 = 0;
  bVar4 = false;
  do {
    if (bVar4) {
LAB_00121b11:
      if ((data[*len] == '\0') || ((!bVar4 && (iVar5 = strncmp(data + *len,"]]>",3), iVar5 == 0))))
      {
        pcVar8 = "element content, \"]]>\" found";
        goto LAB_00121e91;
      }
    }
    else {
      if (data[*len] != (char)buf._1020_4_) goto LAB_00121b11;
      if (((char)buf._1020_4_ != '<') || (iVar5 = strncmp(data + *len,"<![CDATA[",9), iVar5 != 0)) {
        if (uVar13 == 0) {
LAB_00121f1c:
          if (local_38 != (char *)0x0) {
            local_38[(int)uVar3] = '\0';
            return local_38;
          }
          pcVar8 = strdup("");
          return pcVar8;
        }
        if (local_38 == (char *)0x0) {
          local_38 = (char *)malloc((long)(int)(uVar13 + 1));
          uVar3 = uVar13;
        }
        else {
          local_38 = (char *)realloc(local_38,(long)(int)(uVar3 + uVar13 + 1));
          uVar3 = uVar3 + uVar13;
        }
        if (local_38 != (char *)0x0) {
          memcpy(local_38 + (int)(uVar3 - uVar13),local_448,(long)(int)uVar13);
          goto LAB_00121f1c;
        }
        goto LAB_00121f2b;
      }
    }
    if (0x3fc < (int)uVar13) {
      if (local_38 == (char *)0x0) {
        local_38 = (char *)malloc((ulong)(uVar13 + 1));
        uVar3 = uVar13;
      }
      else {
        local_38 = (char *)ly_realloc(local_38,(ulong)(uVar3 + uVar13 + 1));
        uVar3 = uVar3 + uVar13;
      }
      if (local_38 == (char *)0x0) {
LAB_00121f2b:
        pLVar7 = ly_errno_location();
        *pLVar7 = LY_EMEM;
        ly_log(LY_LLERR,"Memory allocation failed (%s()).","parse_text");
        return (char *)0x0;
      }
      memcpy(local_38 + (int)(uVar3 - uVar13),local_448,(ulong)uVar13);
      uVar13 = 0;
    }
    if (bVar4) {
LAB_00121bae:
      uVar9 = *len;
      cVar10 = data[uVar9];
      if ((cVar10 == '\0') || (iVar5 = strncmp(data + uVar9,"]]>",3), iVar5 != 0)) {
        local_448[(int)uVar13] = cVar10;
        *len = uVar9 + 1;
        bVar4 = true;
      }
      else {
        *len = uVar9 + 3;
        uVar13 = uVar13 - 1;
LAB_00121e7b:
        bVar4 = false;
      }
    }
    else {
      uVar9 = *len;
      pcVar8 = data + uVar9;
      iVar5 = strncmp(pcVar8,"<![CDATA[",9);
      if (iVar5 == 0) {
        *len = uVar9 + 9;
        goto LAB_00121bae;
      }
      if (*pcVar8 != '&') {
        uVar9 = copyutf8(local_448 + (int)uVar13,pcVar8);
        if (uVar9 != 0) {
          uVar13 = (uVar13 + uVar9) - 1;
          *len = *len + uVar9;
          goto LAB_00121e7b;
        }
        goto LAB_00121ea1;
      }
      uVar14 = uVar9 + 1;
      *len = uVar14;
      if (data[uVar14] != '#') {
        pcVar8 = data + uVar14;
        iVar5 = strncmp(pcVar8,"lt;",3);
        if (iVar5 == 0) {
          local_448[(int)uVar13] = '<';
LAB_00121e55:
          uVar9 = uVar9 + 4;
        }
        else {
          iVar5 = strncmp(pcVar8,"gt;",3);
          if (iVar5 == 0) {
            local_448[(int)uVar13] = '>';
            goto LAB_00121e55;
          }
          iVar5 = strncmp(pcVar8,"amp;",4);
          if (iVar5 == 0) {
            local_448[(int)uVar13] = '&';
            uVar9 = uVar9 + 5;
          }
          else {
            iVar5 = strncmp(pcVar8,"apos;",5);
            if (iVar5 == 0) {
              local_448[(int)uVar13] = '\'';
            }
            else {
              iVar5 = strncmp(pcVar8,"quot;",5);
              if (iVar5 != 0) {
                pcVar8 = "entity reference (only predefined references are supported)";
                goto LAB_00121e91;
              }
              local_448[(int)uVar13] = '\"';
            }
            uVar9 = uVar9 + 6;
          }
        }
        *len = uVar9;
        goto LAB_00121e7b;
      }
      uVar14 = uVar9 + 2;
      *len = uVar14;
      ppuVar6 = __ctype_b_loc();
      puVar2 = *ppuVar6;
      if ((*(byte *)((long)puVar2 + (long)data[uVar14] * 2 + 1) & 8) == 0) {
        *len = uVar9 + 3;
        if (data[uVar14] != 'x') {
          pcVar8 = "character reference";
          goto LAB_00121e91;
        }
        if ((*(byte *)((long)puVar2 + (long)data[uVar9 + 3] * 2 + 1) & 0x10) == 0) {
          pcVar8 = "character reference";
          goto LAB_00121e91;
        }
        uVar9 = *len;
        lVar11 = (long)data[uVar9];
        uVar1 = puVar2[lVar11];
        iVar5 = 0;
        if ((uVar1 >> 0xc & 1) != 0) {
          iVar5 = 0;
          do {
            uVar9 = uVar9 + 1;
            iVar12 = (uint)((char)lVar11 < 'G') * 0x20 + -0x57;
            if ((uVar1 >> 0xb & 1) != 0) {
              iVar12 = -0x30;
            }
            iVar5 = iVar5 * 0x10 + (int)(char)lVar11 + iVar12;
            *len = uVar9;
            lVar11 = (long)data[uVar9];
            uVar1 = puVar2[lVar11];
          } while ((uVar1 >> 0xc & 1) != 0);
        }
      }
      else {
        uVar9 = *len;
        cVar10 = data[uVar9];
        lVar11 = (long)cVar10;
        iVar5 = 0;
        if ((*(byte *)((long)puVar2 + lVar11 * 2 + 1) & 8) != 0) {
          iVar5 = 0;
          do {
            uVar9 = uVar9 + 1;
            iVar5 = (int)(char)lVar11 + iVar5 * 10 + -0x30;
            *len = uVar9;
            cVar10 = data[uVar9];
            lVar11 = (long)cVar10;
          } while ((*(byte *)((long)puVar2 + lVar11 * 2 + 1) & 8) != 0);
        }
        if (cVar10 != ';') {
          pcVar8 = "character reference, missing semicolon";
          goto LAB_00121e91;
        }
      }
      uVar9 = pututf8(local_448 + (int)uVar13,iVar5);
      if (uVar9 == 0) {
        pcVar8 = "character reference value";
LAB_00121e91:
        ly_vlog(LYE_XML_INVAL,LY_VLOG_NONE,(void *)0x0,pcVar8);
LAB_00121ea1:
        free(local_38);
        return (char *)0x0;
      }
      uVar13 = (uVar13 + uVar9) - 1;
      *len = *len + 1;
      bVar4 = false;
    }
    uVar13 = uVar13 + 1;
  } while( true );
}

Assistant:

static char *
parse_text(const char *data, char delim, unsigned int *len)
{
#define BUFSIZE 1024

    char buf[BUFSIZE];
    char *result = NULL, *aux;
    unsigned int r;
    int o, size = 0;
    int cdsect = 0;
    int32_t n;

    for (*len = o = 0; cdsect || data[*len] != delim; o++) {
        if (!data[*len] || (!cdsect && !strncmp(&data[*len], "]]>", 3))) {
            LOGVAL(LYE_XML_INVAL, LY_VLOG_NONE, NULL, "element content, \"]]>\" found");
            goto error;
        }

loop:

        if (o > BUFSIZE - 4) {
            /* add buffer into the result */
            if (result) {
                size = size + o;
                aux = ly_realloc(result, size + 1);
                result = aux;
            } else {
                size = o;
                result = malloc((size + 1) * sizeof *result);
            }
            if (!result) {
                LOGMEM;
                return NULL;
            }
            memcpy(&result[size - o], buf, o);

            /* write again into the beginning of the buffer */
            o = 0;
        }

        if (cdsect || !strncmp(&data[*len], "<![CDATA[", 9)) {
            /* CDSect */
            if (!cdsect) {
                cdsect = 1;
                *len += 9;
            }
            if (data[*len] && !strncmp(&data[*len], "]]>", 3)) {
                *len += 3;
                cdsect = 0;
                o--;            /* we don't write any data in this iteration */
            } else {
                buf[o] = data[*len];
                (*len)++;
            }
        } else if (data[*len] == '&') {
            (*len)++;
            if (data[*len] != '#') {
                /* entity reference - only predefined refs are supported */
                if (!strncmp(&data[*len], "lt;", 3)) {
                    buf[o] = '<';
                    *len += 3;
                } else if (!strncmp(&data[*len], "gt;", 3)) {
                    buf[o] = '>';
                    *len += 3;
                } else if (!strncmp(&data[*len], "amp;", 4)) {
                    buf[o] = '&';
                    *len += 4;
                } else if (!strncmp(&data[*len], "apos;", 5)) {
                    buf[o] = '\'';
                    *len += 5;
                } else if (!strncmp(&data[*len], "quot;", 5)) {
                    buf[o] = '\"';
                    *len += 5;
                } else {
                    LOGVAL(LYE_XML_INVAL, LY_VLOG_NONE, NULL, "entity reference (only predefined references are supported)");
                    goto error;
                }
            } else {
                /* character reference */
                (*len)++;
                if (isdigit(data[*len])) {
                    for (n = 0; isdigit(data[*len]); (*len)++) {
                        n = (10 * n) + (data[*len] - '0');
                    }
                    if (data[*len] != ';') {
                        LOGVAL(LYE_XML_INVAL, LY_VLOG_NONE, NULL, "character reference, missing semicolon");
                        goto error;
                    }
                } else if (data[(*len)++] == 'x' && isxdigit(data[*len])) {
                    for (n = 0; isxdigit(data[*len]); (*len)++) {
                        if (isdigit(data[*len])) {
                            r = (data[*len] - '0');
                        } else if (data[*len] > 'F') {
                            r = 10 + (data[*len] - 'a');
                        } else {
                            r = 10 + (data[*len] - 'A');
                        }
                        n = (16 * n) + r;
                    }
                } else {
                    LOGVAL(LYE_XML_INVAL, LY_VLOG_NONE, NULL, "character reference");
                    goto error;

                }
                r = pututf8(&buf[o], n);
                if (!r) {
                    LOGVAL(LYE_XML_INVAL, LY_VLOG_NONE, NULL, "character reference value");
                    goto error;
                }
                o += r - 1;     /* o is ++ in for loop */
                (*len)++;
            }
        } else {
            r = copyutf8(&buf[o], &data[*len]);
            if (!r) {
                goto error;
            }

            o += r - 1;     /* o is ++ in for loop */
            (*len) = (*len) + r;
        }
    }

    if (delim == '<' && !strncmp(&data[*len], "<![CDATA[", 9)) {
        /* ignore loop's end condition on beginning of CDSect */
        goto loop;
    }
#undef BUFSIZE

    if (o) {
        if (result) {
            size = size + o;
            aux = realloc(result, size + 1);
            result = aux;
        } else {
            size = o;
            result = malloc((size + 1) * sizeof *result);
        }
        if (!result) {
            LOGMEM;
            return NULL;
        }
        memcpy(&result[size - o], buf, o);
    }
    if (result) {
        result[size] = '\0';
    } else {
        size = 0;
        result = strdup("");
    }

    return result;

error:
    free(result);
    return NULL;
}